

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O3

void ScanLine(int x1,int y1,int x2,int y2,int ymax,vector<int,_std::allocator<int>_> *xrange)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  
  uVar7 = x2 - x1;
  uVar5 = y2 - y1;
  iVar11 = (int)uVar7 >> 0x1f;
  if (0 < (int)uVar7) {
    iVar11 = 1;
  }
  iVar2 = (int)uVar5 >> 0x1f;
  if (0 < (int)uVar5) {
    iVar2 = 1;
  }
  uVar10 = -uVar7;
  if (0 < (int)uVar7) {
    uVar10 = uVar7;
  }
  uVar7 = -uVar5;
  if (0 < (int)uVar5) {
    uVar7 = uVar5;
  }
  if (uVar10 < uVar7) {
    iVar8 = 0;
    uVar5 = uVar7;
    iVar9 = iVar2;
    uVar7 = uVar10;
  }
  else {
    iVar9 = 0;
    iVar8 = iVar11;
    uVar5 = uVar10;
  }
  uVar10 = uVar7 >> 1;
  piVar1 = (xrange->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar12 = uVar5 + 1;
  do {
    if (y1 < ymax && -1 < y1) {
      uVar6 = y1 * 2;
      if (x1 < piVar1[uVar6]) {
        piVar1[uVar6] = x1;
      }
      if (piVar1[uVar6 | 1] < x1) {
        piVar1[uVar6 | 1] = x1;
      }
    }
    uVar6 = uVar5;
    iVar3 = iVar11;
    iVar4 = iVar2;
    if ((int)(uVar10 + uVar7) < (int)uVar5) {
      uVar6 = 0;
      iVar3 = iVar8;
      iVar4 = iVar9;
    }
    uVar10 = (uVar10 + uVar7) - uVar6;
    y1 = y1 + iVar4;
    x1 = x1 + iVar3;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  return;
}

Assistant:

void ScanLine(int x1, int y1, int x2, int y2, int ymax, std::vector<int> & xrange) {
    int sx, sy, dx1, dy1, dx2, dy2, x, y, m, n, k, cnt;

    sx = x2 - x1;
    sy = y2 - y1;

    if (sx > 0) dx1 = 1;
    else if (sx < 0) dx1 = -1;
    else dx1 = 0;

    if (sy > 0) dy1 = 1;
    else if (sy < 0) dy1 = -1;
    else dy1 = 0;

    m = ABS(sx);
    n = ABS(sy);
    dx2 = dx1;
    dy2 = 0;

    if (m < n)
    {
        m = ABS(sy);
        n = ABS(sx);
        dx2 = 0;
        dy2 = dy1;
    }

    x = x1; y = y1;
    cnt = m + 1;
    k = n / 2;

    while (cnt--) {
        if ((y >= 0) && (y < ymax)) {
            if (x < xrange[2*y+0]) xrange[2*y+0] = x;
            if (x > xrange[2*y+1]) xrange[2*y+1] = x;
        }

        k += n;
        if (k < m) {
            x += dx2;
            y += dy2;
        } else {
            k -= m;
            x += dx1;
            y += dy1;
        }
    }
}